

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void preprocess_signed(aec_stream *strm)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  internal_state *piVar5;
  uint *puVar6;
  uint32_t *puVar7;
  uint uVar8;
  size_t i;
  uint32_t m;
  uint32_t rsi;
  int32_t xmin;
  int32_t xmax;
  uint32_t *d;
  int32_t *x;
  internal_state *state;
  uint32_t D;
  aec_stream *strm_local;
  
  piVar5 = strm->state;
  puVar6 = piVar5->data_raw;
  puVar7 = piVar5->data_pp;
  uVar1 = piVar5->xmax;
  uVar2 = piVar5->xmin;
  uVar3 = strm->rsi;
  uVar4 = strm->block_size;
  uVar8 = (uint)(1L << ((char)strm->bits_per_sample - 1U & 0x3f));
  piVar5->ref = 1;
  piVar5->ref_sample = *puVar6;
  *puVar7 = 0;
  *puVar6 = (*puVar6 ^ uVar8) - uVar8;
  for (i = 0; i < uVar3 * uVar4 - 1; i = i + 1) {
    puVar6[i + 1] = (puVar6[i + 1] ^ uVar8) - uVar8;
    if ((int)puVar6[i + 1] < (int)puVar6[i]) {
      if (uVar1 - puVar6[i] < puVar6[i] - puVar6[i + 1]) {
        puVar7[i + 1] = uVar1 - puVar6[i + 1];
      }
      else {
        puVar7[i + 1] = (puVar6[i] - puVar6[i + 1]) * 2 - 1;
      }
    }
    else if (puVar6[i] - uVar2 < puVar6[i + 1] - puVar6[i]) {
      puVar7[i + 1] = puVar6[i + 1] - uVar2;
    }
    else {
      puVar7[i + 1] = (puVar6[i + 1] - puVar6[i]) * 2;
    }
  }
  piVar5->uncomp_len = (strm->block_size - 1) * strm->bits_per_sample;
  return;
}

Assistant:

static void preprocess_signed(struct aec_stream *strm)
{
    /**
       Preprocess RSI of signed samples.
    */

    uint32_t D;
    struct internal_state *state = strm->state;
    int32_t *restrict x = (int32_t *)state->data_raw;
    uint32_t *restrict d = state->data_pp;
    int32_t xmax = (int32_t)state->xmax;
    int32_t xmin = (int32_t)state->xmin;
    uint32_t rsi = strm->rsi * strm->block_size - 1;
    uint32_t m = UINT64_C(1) << (strm->bits_per_sample - 1);

    state->ref = 1;
    state->ref_sample = x[0];
    d[0] = 0;
    x[0] = (x[0] ^ m) - m;

    for (size_t i = 0; i < rsi; i++) {
        x[i + 1] = (x[i + 1] ^ m) - m;
        if (x[i + 1] < x[i]) {
            D = (uint32_t)(x[i] - x[i + 1]);
            if (D <= (uint32_t)(xmax - x[i]))
                d[i + 1] = 2 * D - 1;
            else
                d[i + 1] = xmax - x[i + 1];
        } else {
            D = (uint32_t)(x[i + 1] - x[i]);
            if (D <= (uint32_t)(x[i] - xmin))
                d[i + 1] = 2 * D;
            else
                d[i + 1] = x[i + 1] - xmin;
        }
    }
    state->uncomp_len = (strm->block_size - 1) * strm->bits_per_sample;
}